

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseAssembler::embedDataArray
          (BaseAssembler *this,TypeId typeId,void *data,size_t itemCount,size_t repeatCount)

{
  Section *pSVar1;
  Logger *pLVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  Error extraout_EAX;
  Error EVar7;
  ulong uVar8;
  ulong uVar9;
  size_t repeatCount_00;
  undefined1 *puVar10;
  size_t itemCount_00;
  long lVar11;
  uint8_t *__dest;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined1 *local_240;
  undefined1 local_238 [520];
  
  cVar6 = (((this->super_BaseEmitter)._environment._arch & k32BitMask) == kUnknown) * '\x02' +
          '\x06';
  if ((typeId & 0xfe) != _kBaseStart) {
    cVar6 = '\0';
  }
  if (0x44 < (byte)((cVar6 + typeId) - 0x20)) {
    EVar7 = 2;
LAB_00115603:
    EVar7 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar7,(char *)0x0);
    return EVar7;
  }
  if (repeatCount == 0 || itemCount == 0) {
LAB_001155dd:
    EVar7 = 0;
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = itemCount;
    uVar8 = SUB168(auVar3 * ZEXT116((byte)TypeUtils::_typeData
                                          [(ulong)(byte)(cVar6 + typeId) + 0x100]),0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar8;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = repeatCount;
    uVar9 = SUB168(auVar4 * auVar5,0);
    if ((SUB168(auVar3 * ZEXT116((byte)TypeUtils::_typeData[(ulong)(byte)(cVar6 + typeId) + 0x100]),
                8) != 0) || (SUB168(auVar4 * auVar5,8) != 0)) {
      EVar7 = 1;
      goto LAB_00115603;
    }
    __dest = this->_bufferPtr;
    repeatCount_00 = repeatCount;
    itemCount_00 = itemCount;
    if ((ulong)((long)this->_bufferEnd - (long)__dest) < uVar9) {
      EVar7 = CodeHolder::growBuffer((this->super_BaseEmitter)._code,&this->_section->_buffer,uVar9)
      ;
      if (EVar7 != 0) goto LAB_0011564c;
      __dest = this->_bufferPtr;
    }
    do {
      repeatCount = repeatCount_00;
      if (uVar8 == 0) {
        embedDataArray();
        itemCount = itemCount_00;
      }
      else {
        lVar11 = -(long)__dest;
        do {
          memcpy(__dest,data,uVar8);
          __dest = __dest + uVar8;
          lVar11 = lVar11 - uVar8;
          repeatCount = repeatCount - 1;
        } while (repeatCount != 0);
        pSVar1 = this->_section;
        itemCount = -(long)(this->_bufferData + lVar11);
        uVar9 = (pSVar1->_buffer)._capacity;
        if (itemCount < uVar9 || (uint8_t *)-uVar9 == this->_bufferData + lVar11) {
          this->_bufferPtr = __dest;
          uVar8 = (pSVar1->_buffer)._size;
          if (itemCount < uVar8) {
            itemCount = uVar8;
          }
          (pSVar1->_buffer)._size = itemCount;
          pLVar2 = (this->super_BaseEmitter)._logger;
          if (pLVar2 != (Logger *)0x0) {
            local_240 = local_238;
            uStack_250 = 0;
            local_258 = 0x20;
            local_248 = 0x207;
            local_238[0] = 0;
            Formatter::formatData
                      ((String *)&local_258,(pLVar2->_options)._flags,
                       (this->super_BaseEmitter)._environment._arch,typeId,data,itemCount_00,
                       repeatCount_00);
            String::_opChar((String *)&local_258,kAppend,'\n');
            pLVar2 = (this->super_BaseEmitter)._logger;
            uVar8 = uStack_250;
            puVar10 = local_240;
            if ((local_258 & 0xff) < 0x1f) {
              uVar8 = local_258 & 0xff;
              puVar10 = (undefined1 *)((long)&local_258 + 1);
            }
            (*pLVar2->_vptr_Logger[2])(pLVar2,puVar10,uVar8);
            String::reset((String *)&local_258);
          }
          goto LAB_001155dd;
        }
      }
      embedDataArray();
      EVar7 = extraout_EAX;
LAB_0011564c:
      EVar7 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar7,(char *)0x0);
      repeatCount_00 = repeatCount;
      itemCount_00 = itemCount;
    } while (EVar7 == 0);
  }
  return EVar7;
}

Assistant:

Error BaseAssembler::embedDataArray(TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) {
  uint32_t deabstractDelta = TypeUtils::deabstractDeltaOfSize(registerSize());
  TypeId finalTypeId = TypeUtils::deabstract(typeId, deabstractDelta);

  if (ASMJIT_UNLIKELY(!TypeUtils::isValid(finalTypeId)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (itemCount == 0 || repeatCount == 0)
    return kErrorOk;

  uint32_t typeSize = TypeUtils::sizeOf(finalTypeId);
  Support::FastUInt8 of = 0;

  size_t dataSize = Support::mulOverflow(itemCount, size_t(typeSize), &of);
  size_t totalSize = Support::mulOverflow(dataSize, repeatCount, &of);

  if (ASMJIT_UNLIKELY(of))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, totalSize));

  for (size_t i = 0; i < repeatCount; i++)
    writer.emitData(data, dataSize);

  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<512> sb;
    Formatter::formatData(sb, _logger->flags(), arch(), typeId, data, itemCount, repeatCount);
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}